

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetFileImmutableClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *file)

{
  string_view classname;
  bool bVar1;
  ulong uVar2;
  FileOptions *pFVar3;
  string *psVar4;
  string local_48;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char>_>_>
  local_28;
  string *class_name;
  FileDescriptor *file_local;
  ClassNameResolver *this_local;
  
  class_name = (string *)file;
  file_local = (FileDescriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  local_28 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::__cxx11::string>>>
             ::
             operator[]<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::__cxx11::string>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::__cxx11::string>>>
                         *)&this->file_immutable_outer_class_names_,
                        (key_arg<const_google::protobuf::FileDescriptor_*> *)&class_name);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    pFVar3 = FileDescriptor::options((FileDescriptor *)class_name);
    bVar1 = FileOptions::has_java_outer_classname(pFVar3);
    if (bVar1) {
      pFVar3 = FileDescriptor::options((FileDescriptor *)class_name);
      psVar4 = FileOptions::java_outer_classname_abi_cxx11_(pFVar3);
      std::__cxx11::string::operator=((string *)local_28,(string *)psVar4);
    }
    else {
      GetFileDefaultImmutableClassName_abi_cxx11_(&local_48,this,(FileDescriptor *)class_name);
      std::__cxx11::string::operator=((string *)local_28,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      bVar1 = java::anon_unknown_0::UseOldFileClassNameDefault((FileDescriptor *)class_name);
      psVar4 = class_name;
      if (bVar1) {
        classname = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
        bVar1 = HasConflictingClassName(this,(FileDescriptor *)psVar4,classname,EXACT_EQUAL);
        if (bVar1) {
          std::__cxx11::string::operator+=
                    ((string *)local_28,java::(anonymous_namespace)::kOuterClassNameSuffix);
        }
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetFileImmutableClassName(
    const FileDescriptor* file) {
  std::string& class_name = file_immutable_outer_class_names_[file];
  if (class_name.empty()) {
    if (file->options().has_java_outer_classname()) {
      class_name = file->options().java_outer_classname();
    } else {
      class_name = GetFileDefaultImmutableClassName(file);

      // This disambiguation logic is deprecated and only enabled when using
      // the old default scheme.
      if (UseOldFileClassNameDefault(file) &&
          HasConflictingClassName(file, class_name,
                                  NameEquality::EXACT_EQUAL)) {
        class_name += kOuterClassNameSuffix;
      }
    }
  }
  return class_name;
}